

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::
CreateAttributesDecoder
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *this,
          int32_t att_decoder_id)

{
  ushort uVar1;
  Mesh *mesh;
  TraversalObserver traversal_observer;
  bool bVar2;
  MeshEdgebreakerDecoder *pMVar3;
  _Head_base<0UL,_draco::PointsSequencer_*,_false> this_00;
  tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  this_01;
  pointer pAVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  MeshAttributeIndicesEncodingData *encoding_data;
  int8_t att_data_id;
  uint8_t decoder_type;
  uint8_t traversal_method_encoded;
  char local_10a;
  uchar local_109;
  __uniq_ptr_impl<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> local_108;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  local_100;
  pointer local_f8;
  Mesh *local_f0;
  MeshAttributeCornerTable *local_e8;
  MeshAttributeIndicesEncodingData *pMStack_e0;
  Mesh *local_d8;
  _Head_base<0UL,_draco::PointsSequencer_*,_false> _Stack_d0;
  byte local_c8;
  undefined7 uStack_c7;
  
  bVar2 = DecoderBuffer::Decode<signed_char>
                    ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_,&local_10a)
  ;
  if ((bVar2) &&
     (bVar2 = DecoderBuffer::Decode<unsigned_char>
                        ((this->decoder_->super_MeshDecoder).super_PointCloudDecoder.buffer_,
                         &local_109), bVar2)) {
    uVar7 = (ulong)local_10a;
    if ((long)uVar7 < 0) {
      if (-1 < this->pos_data_decoder_id_) {
        return false;
      }
      pAVar4 = (pointer)&this->pos_data_decoder_id_;
    }
    else {
      pAVar4 = (this->attribute_data_).
               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->attribute_data_).
                         super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4) / 0x140) <=
          uVar7) {
        return false;
      }
      if (-1 < pAVar4[uVar7].decoder_id) {
        return false;
      }
      pAVar4 = pAVar4 + uVar7;
    }
    pAVar4->decoder_id = att_decoder_id;
    pMVar3 = this->decoder_;
    uVar1._0_1_ = (pMVar3->super_MeshDecoder).super_PointCloudDecoder.version_major_;
    uVar1._1_1_ = (pMVar3->super_MeshDecoder).super_PointCloudDecoder.version_minor_;
    bVar6 = 0;
    if (0x101 < (ushort)(uVar1 << 8 | uVar1 >> 8)) {
      bVar2 = DecoderBuffer::Decode<unsigned_char>
                        ((pMVar3->super_MeshDecoder).super_PointCloudDecoder.buffer_,
                         &stack0xffffffffffffff38);
      if (1 < local_c8 || !bVar2) {
        return false;
      }
      bVar6 = false;
      if (bVar2) {
        bVar6 = local_c8;
      }
      pMVar3 = this->decoder_;
    }
    if (local_109 == '\0') {
      if (-1 < (long)local_10a) {
        (this->attribute_data_).
        super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
        ._M_impl.super__Vector_impl_data._M_start[local_10a].is_connectivity_used = false;
      }
      if (bVar6 == 1) {
        CreateVertexTraversalSequencer<draco::MaxPredictionDegreeTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
                  ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *)
                   &stack0xffffffffffffff38,(MeshAttributeIndicesEncodingData *)this);
      }
      else {
        CreateVertexTraversalSequencer<draco::DepthFirstTraverser<draco::CornerTable,draco::MeshAttributeIndicesEncodingObserver<draco::CornerTable>>>
                  ((MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder> *)
                   &stack0xffffffffffffff38,(MeshAttributeIndicesEncodingData *)this);
      }
      this_00._M_head_impl = (PointsSequencer *)CONCAT71(uStack_c7,local_c8);
      if ((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
           *)this_00._M_head_impl !=
          (MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
           *)0x0) goto LAB_0012931d;
    }
    else if ((bVar6 == 0) && (lVar5 = (long)local_10a, -1 < lVar5)) {
      mesh = (pMVar3->super_MeshDecoder).mesh_;
      local_f8 = (this->attribute_data_).
                 super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalValenceDecoder>::AttributeData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      encoding_data = &local_f8[lVar5].encoding_data;
      this_00._M_head_impl = (PointsSequencer *)operator_new(0xc0);
      local_f0 = mesh;
      MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
      ::MeshTraversalSequencer
                ((MeshTraversalSequencer<draco::DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>_>
                  *)this_00._M_head_impl,mesh,encoding_data);
      DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::DepthFirstTraverser
                ((DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  *)&stack0xffffffffffffff38);
      local_e8 = &local_f8[lVar5].connectivity_data;
      local_d8 = local_f0;
      traversal_observer.encoding_data_ = encoding_data;
      traversal_observer.att_connectivity_ = local_e8;
      traversal_observer.mesh_ = local_f0;
      traversal_observer.sequencer_ = this_00._M_head_impl;
      pMStack_e0 = encoding_data;
      _Stack_d0._M_head_impl = this_00._M_head_impl;
      TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::Init((TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
              *)&stack0xffffffffffffff38,local_e8,traversal_observer);
      DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::operator=((DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                   *)((long)this_00._M_head_impl + 0x10),
                  (DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                   *)&stack0xffffffffffffff38);
      DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::~DepthFirstTraverser
                ((DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  *)&stack0xffffffffffffff38);
LAB_0012931d:
      this_01.
      super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
      .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
            )operator_new(0x80);
      local_108._M_t.
      super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
      .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
           (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
           (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
           this_00._M_head_impl;
      SequentialAttributeDecodersController::SequentialAttributeDecodersController
                ((SequentialAttributeDecodersController *)
                 this_01.
                 super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                 .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl,
                 (unique_ptr<draco::PointsSequencer,_std::default_delete<draco::PointsSequencer>_> *
                 )&local_108);
      if ((_Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
          local_108._M_t.
          super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
          .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl !=
          (PointsSequencer *)0x0) {
        (**(code **)(*(long *)local_108._M_t.
                              super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
                              .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl +
                    8))();
      }
      local_108._M_t.
      super__Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
      .super__Head_base<0UL,_draco::PointsSequencer_*,_false>._M_head_impl =
           (tuple<draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>)
           (_Tuple_impl<0UL,_draco::PointsSequencer_*,_std::default_delete<draco::PointsSequencer>_>
           )0x0;
      local_100._M_t.
      super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
      .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
           (tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
            )(tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
              )this_01.
               super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
               .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
      bVar2 = PointCloudDecoder::SetAttributesDecoder
                        ((PointCloudDecoder *)this->decoder_,att_decoder_id,
                         (unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                          *)&local_100);
      if ((_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
           )local_100._M_t.
            super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
            .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl !=
          (AttributesDecoderInterface *)0x0) {
        (**(code **)(*(long *)local_100._M_t.
                              super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                              .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                              _M_head_impl + 8))();
        return bVar2;
      }
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::CreateAttributesDecoder(
    int32_t att_decoder_id) {
  int8_t att_data_id;
  if (!decoder_->buffer()->Decode(&att_data_id)) {
    return false;
  }
  uint8_t decoder_type;
  if (!decoder_->buffer()->Decode(&decoder_type)) {
    return false;
  }

  if (att_data_id >= 0) {
    if (att_data_id >= attribute_data_.size()) {
      return false;  // Unexpected attribute data.
    }

    // Ensure that the attribute data is not mapped to a different attributes
    // decoder already.
    if (attribute_data_[att_data_id].decoder_id >= 0) {
      return false;
    }

    attribute_data_[att_data_id].decoder_id = att_decoder_id;
  } else {
    // Assign the attributes decoder to |pos_encoding_data_|.
    if (pos_data_decoder_id_ >= 0) {
      return false;  // Some other decoder is already using the data. Error.
    }
    pos_data_decoder_id_ = att_decoder_id;
  }

  MeshTraversalMethod traversal_method = MESH_TRAVERSAL_DEPTH_FIRST;
  if (decoder_->bitstream_version() >= DRACO_BITSTREAM_VERSION(1, 2)) {
    uint8_t traversal_method_encoded;
    if (!decoder_->buffer()->Decode(&traversal_method_encoded)) {
      return false;
    }
    // Check that decoded traversal method is valid.
    if (traversal_method_encoded >= NUM_TRAVERSAL_METHODS) {
      return false;
    }
    traversal_method =
        static_cast<MeshTraversalMethod>(traversal_method_encoded);
  }

  const Mesh *mesh = decoder_->mesh();
  std::unique_ptr<PointsSequencer> sequencer;

  if (decoder_type == MESH_VERTEX_ATTRIBUTE) {
    // Per-vertex attribute decoder.

    MeshAttributeIndicesEncodingData *encoding_data = nullptr;
    if (att_data_id < 0) {
      encoding_data = &pos_encoding_data_;
    } else {
      encoding_data = &attribute_data_[att_data_id].encoding_data;
      // Mark the attribute connectivity data invalid to ensure it's not used
      // later on.
      attribute_data_[att_data_id].is_connectivity_used = false;
    }
    // Defining sequencer via a traversal scheme.
    if (traversal_method == MESH_TRAVERSAL_PREDICTION_DEGREE) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef MaxPredictionDegreeTraverser<CornerTable, AttObserver>
          AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else if (traversal_method == MESH_TRAVERSAL_DEPTH_FIRST) {
      typedef MeshAttributeIndicesEncodingObserver<CornerTable> AttObserver;
      typedef DepthFirstTraverser<CornerTable, AttObserver> AttTraverser;
      sequencer = CreateVertexTraversalSequencer<AttTraverser>(encoding_data);
    } else {
      return false;  // Unsupported method
    }
  } else {
    if (traversal_method != MESH_TRAVERSAL_DEPTH_FIRST) {
      return false;  // Unsupported method.
    }
    if (att_data_id < 0) {
      return false;  // Attribute data must be specified.
    }

    // Per-corner attribute decoder.

    typedef MeshAttributeIndicesEncodingObserver<MeshAttributeCornerTable>
        AttObserver;
    typedef DepthFirstTraverser<MeshAttributeCornerTable, AttObserver>
        AttTraverser;

    MeshAttributeIndicesEncodingData *const encoding_data =
        &attribute_data_[att_data_id].encoding_data;
    const MeshAttributeCornerTable *const corner_table =
        &attribute_data_[att_data_id].connectivity_data;

    std::unique_ptr<MeshTraversalSequencer<AttTraverser>> traversal_sequencer(
        new MeshTraversalSequencer<AttTraverser>(mesh, encoding_data));

    AttObserver att_observer(corner_table, mesh, traversal_sequencer.get(),
                             encoding_data);

    AttTraverser att_traverser;
    att_traverser.Init(corner_table, att_observer);

    traversal_sequencer->SetTraverser(att_traverser);
    sequencer = std::move(traversal_sequencer);
  }

  if (!sequencer) {
    return false;
  }

  std::unique_ptr<SequentialAttributeDecodersController> att_controller(
      new SequentialAttributeDecodersController(std::move(sequencer)));

  return decoder_->SetAttributesDecoder(att_decoder_id,
                                        std::move(att_controller));
}